

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::SkipField
               (CodedInputStream *input,uint32 tag,CodedOutputStream *output)

{
  uint64 *puVar1;
  uint8 *puVar2;
  byte *pbVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  byte *pbVar8;
  uint32 uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  pair<unsigned_long,_bool> pVar13;
  string temp;
  string local_48;
  
  if (tag < 8) goto LAB_003340db;
  bVar5 = 0;
  switch(tag & 7) {
  case 0:
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar6 = (ulong)(char)*puVar2, -1 < (long)uVar6)) {
      input->buffer_ = puVar2 + 1;
      uVar10 = 1;
    }
    else {
      pVar13 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar6 = pVar13.first;
      uVar10 = pVar13._8_4_;
    }
    bVar5 = (byte)uVar10;
    if ((uVar10 & 1) != 0) {
      if (output->buffer_size_ < 5) {
        io::CodedOutputStream::WriteVarint32SlowPath(output,tag);
      }
      else {
        pbVar3 = output->buffer_;
        pbVar8 = pbVar3;
        uVar9 = tag;
        if (0x7f < tag) {
          do {
            *pbVar8 = (byte)tag | 0x80;
            uVar9 = tag >> 7;
            pbVar8 = pbVar8 + 1;
            bVar4 = 0x3fff < tag;
            tag = uVar9;
          } while (bVar4);
        }
        *pbVar8 = (byte)uVar9;
        iVar7 = ((int)pbVar8 - (int)pbVar3) + 1;
        output->buffer_ = output->buffer_ + iVar7;
        output->buffer_size_ = output->buffer_size_ - iVar7;
      }
      if (output->buffer_size_ < 10) {
        io::CodedOutputStream::WriteVarint64SlowPath(output,uVar6);
      }
      else {
        pbVar3 = output->buffer_;
        pbVar8 = pbVar3;
        uVar11 = uVar6;
        if (0x7f < uVar6) {
          do {
            *pbVar8 = (byte)uVar11 | 0x80;
            uVar6 = uVar11 >> 7;
            pbVar8 = pbVar8 + 1;
            bVar4 = 0x3fff < uVar11;
            uVar11 = uVar6;
          } while (bVar4);
        }
        *pbVar8 = (byte)uVar6;
        iVar7 = ((int)pbVar8 - (int)pbVar3) + 1;
        output->buffer_ = output->buffer_ + iVar7;
        output->buffer_size_ = output->buffer_size_ - iVar7;
      }
    }
    break;
  case 1:
    puVar1 = (uint64 *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar1 < 8) {
      bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_48);
    }
    else {
      local_48._M_dataplus._M_p = (pointer)*puVar1;
      input->buffer_ = (uint8 *)(puVar1 + 1);
      bVar5 = true;
    }
    if ((bool)bVar5 != false) {
      if (output->buffer_size_ < 5) {
        io::CodedOutputStream::WriteVarint32SlowPath(output,tag);
      }
      else {
        pbVar3 = output->buffer_;
        pbVar8 = pbVar3;
        uVar9 = tag;
        if (0x7f < tag) {
          do {
            *pbVar8 = (byte)tag | 0x80;
            uVar9 = tag >> 7;
            pbVar8 = pbVar8 + 1;
            bVar4 = 0x3fff < tag;
            tag = uVar9;
          } while (bVar4);
        }
        *pbVar8 = (byte)uVar9;
        iVar7 = ((int)pbVar8 - (int)pbVar3) + 1;
        output->buffer_ = output->buffer_ + iVar7;
        output->buffer_size_ = output->buffer_size_ - iVar7;
      }
      io::CodedOutputStream::WriteLittleEndian64(output,(uint64)local_48._M_dataplus._M_p);
    }
    break;
  case 2:
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      bVar5 = *pbVar3;
      uVar6 = (ulong)bVar5;
      uVar9 = (uint32)bVar5;
      if ((char)bVar5 < '\0') goto LAB_0033441a;
      input->buffer_ = pbVar3 + 1;
      bVar4 = true;
    }
    else {
      uVar9 = 0;
LAB_0033441a:
      uVar6 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      bVar4 = -1 < (long)uVar6;
    }
    if (bVar4) {
      if (output->buffer_size_ < 5) {
        io::CodedOutputStream::WriteVarint32SlowPath(output,tag);
      }
      else {
        pbVar3 = output->buffer_;
        pbVar8 = pbVar3;
        uVar9 = tag;
        if (0x7f < tag) {
          do {
            *pbVar8 = (byte)tag | 0x80;
            uVar9 = tag >> 7;
            pbVar8 = pbVar8 + 1;
            bVar4 = 0x3fff < tag;
            tag = uVar9;
          } while (bVar4);
        }
        *pbVar8 = (byte)uVar9;
        iVar7 = ((int)pbVar8 - (int)pbVar3) + 1;
        output->buffer_ = output->buffer_ + iVar7;
        output->buffer_size_ = output->buffer_size_ - iVar7;
      }
      uVar10 = (uint)uVar6;
      if (output->buffer_size_ < 5) {
        io::CodedOutputStream::WriteVarint32SlowPath(output,uVar10);
      }
      else {
        pbVar3 = output->buffer_;
        uVar11 = uVar6 & 0xffffffff;
        pbVar8 = pbVar3;
        if (0x7f < uVar10) {
          uVar11 = uVar6 & 0xffffffff;
          do {
            uVar12 = (uint)uVar11;
            *pbVar8 = (byte)uVar11 | 0x80;
            uVar11 = uVar11 >> 7;
            pbVar8 = pbVar8 + 1;
          } while (0x3fff < uVar12);
        }
        *pbVar8 = (byte)uVar11;
        iVar7 = ((int)pbVar8 - (int)pbVar3) + 1;
        output->buffer_ = output->buffer_ + iVar7;
        output->buffer_size_ = output->buffer_size_ - iVar7;
      }
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      bVar5 = io::CodedInputStream::ReadString(input,&local_48,uVar10);
      if ((bool)bVar5) {
        io::CodedOutputStream::WriteRaw
                  (output,local_48._M_dataplus._M_p,(int)local_48._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                 local_48.field_2._M_local_buf[0]) + 1);
      }
      break;
    }
    goto LAB_003340db;
  case 3:
    if (output->buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,tag);
    }
    else {
      pbVar3 = output->buffer_;
      pbVar8 = pbVar3;
      uVar9 = tag;
      uVar10 = tag;
      if (0x7f < tag) {
        do {
          *pbVar8 = (byte)uVar10 | 0x80;
          uVar9 = uVar10 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar4 = 0x3fff < uVar10;
          uVar10 = uVar9;
        } while (bVar4);
      }
      *pbVar8 = (byte)uVar9;
      iVar7 = ((int)pbVar8 - (int)pbVar3) + 1;
      output->buffer_ = output->buffer_ + iVar7;
      output->buffer_size_ = output->buffer_size_ - iVar7;
    }
    iVar7 = input->recursion_budget_;
    input->recursion_budget_ = iVar7 + -1;
    if ((0 < iVar7) && (bVar4 = SkipMessage(input,output), bVar4)) {
      if (input->recursion_budget_ < input->recursion_limit_) {
        input->recursion_budget_ = input->recursion_budget_ + 1;
      }
      bVar5 = input->last_tag_ == (tag & 0xfffffff8 | 4);
      break;
    }
LAB_003340db:
    bVar5 = 0;
    break;
  case 5:
    puVar2 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar2 < 4) {
      bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_48);
    }
    else {
      local_48._M_dataplus._M_p._0_4_ = *(undefined4 *)puVar2;
      input->buffer_ = puVar2 + 4;
      bVar5 = true;
    }
    if ((bool)bVar5 != false) {
      if (output->buffer_size_ < 5) {
        io::CodedOutputStream::WriteVarint32SlowPath(output,tag);
      }
      else {
        pbVar3 = output->buffer_;
        pbVar8 = pbVar3;
        uVar9 = tag;
        if (0x7f < tag) {
          do {
            *pbVar8 = (byte)tag | 0x80;
            uVar9 = tag >> 7;
            pbVar8 = pbVar8 + 1;
            bVar4 = 0x3fff < tag;
            tag = uVar9;
          } while (bVar4);
        }
        *pbVar8 = (byte)uVar9;
        iVar7 = ((int)pbVar8 - (int)pbVar3) + 1;
        output->buffer_ = output->buffer_ + iVar7;
        output->buffer_size_ = output->buffer_size_ - iVar7;
      }
      io::CodedOutputStream::WriteLittleEndian32(output,(uint32)local_48._M_dataplus._M_p);
    }
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool WireFormatLite::SkipField(
    io::CodedInputStream* input, uint32 tag, io::CodedOutputStream* output) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64 value;
      if (!input->ReadVarint64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64 value;
      if (!input->ReadLittleEndian64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32 length;
      if (!input->ReadVarint32(&length)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint32(length);
      // TODO(mkilavuz): Provide API to prevent extra string copying.
      string temp;
      if (!input->ReadString(&temp, length)) return false;
      output->WriteString(temp);
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      output->WriteVarint32(tag);
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, output)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(WireFormatLite::MakeTag(
          WireFormatLite::GetTagFieldNumber(tag),
          WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32 value;
      if (!input->ReadLittleEndian32(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian32(value);
      return true;
    }
    default: {
      return false;
    }
  }
}